

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode http_rw_hd(Curl_easy *data,char *hd,size_t hdlen,char *buf_remain,size_t blen,
                   size_t *pconsumed)

{
  ConnectBits *pCVar1;
  undefined1 *puVar2;
  int *piVar3;
  byte bVar4;
  char cVar5;
  uint uVar6;
  curlntlm cVar7;
  upgrade101 uVar8;
  curl_trc_feat *pcVar9;
  _Bool _Var10;
  CURLcode CVar11;
  int iVar12;
  statusline sVar13;
  CURLcode CVar14;
  uint uVar15;
  char *pcVar16;
  size_t hdlen_00;
  void *pvVar17;
  Curl_creader *pCVar18;
  char *pcVar19;
  int iVar20;
  connectdata *pcVar21;
  ulong uVar22;
  dynbuf last_header;
  dynbuf local_50;
  
  *pconsumed = 0;
  if ((*hd != '\r') && (*hd != '\n')) {
    iVar12 = (data->req).headerline;
    (data->req).headerline = iVar12 + 1;
    iVar20 = 4;
    if (iVar12 == 0) {
      (data->req).httpversion = 0;
      pcVar21 = data->conn;
      uVar15 = pcVar21->handler->protocol;
      pcVar16 = hd;
      if ((uVar15 & 0xc0000003) == 0) {
        if ((uVar15 >> 0x12 & 1) != 0) {
          for (; (*pcVar16 == ' ' || (*pcVar16 == '\t')); pcVar16 = pcVar16 + 1) {
          }
          iVar12 = strncmp(pcVar16,"RTSP/",5);
          if (iVar12 == 0) {
            if (9 < (byte)(pcVar16[5] - 0x30U)) {
              return CURLE_WEIRD_SERVER_REPLY;
            }
            if (pcVar16[6] != '.') {
              return CURLE_WEIRD_SERVER_REPLY;
            }
            if (9 < (byte)(pcVar16[7] - 0x30U)) {
              return CURLE_WEIRD_SERVER_REPLY;
            }
            if ((pcVar16[8] != ' ') && (pcVar16[8] != '\t')) {
              return CURLE_WEIRD_SERVER_REPLY;
            }
            if (9 < (byte)(pcVar16[9] - 0x30U)) {
              return CURLE_WEIRD_SERVER_REPLY;
            }
            if (9 < (byte)(pcVar16[10] - 0x30U)) {
              return CURLE_WEIRD_SERVER_REPLY;
            }
            if (9 < (byte)(pcVar16[0xb] - 0x30U)) {
              return CURLE_WEIRD_SERVER_REPLY;
            }
            (data->req).httpcode =
                 (uint)(byte)(pcVar16[0xb] - 0x30U) +
                 (uint)(byte)(pcVar16[10] * '\n' + 0x20) + (uint)(byte)(pcVar16[9] - 0x30U) * 100;
            cVar5 = pcVar16[0xc];
            if (((cVar5 != '\t') && (cVar5 != ' ')) && (3 < (byte)(cVar5 - 10U))) {
              return CURLE_WEIRD_SERVER_REPLY;
            }
            (data->req).httpversion = 0xb;
            goto LAB_00135b18;
          }
        }
      }
      else {
        for (; (*pcVar16 == ' ' || (*pcVar16 == '\t')); pcVar16 = pcVar16 + 1) {
        }
        iVar12 = strncmp(pcVar16,"HTTP/",5);
        if (iVar12 == 0) {
          bVar4 = pcVar16[5];
          if (1 < bVar4 - 0x32) {
            if (bVar4 != 0x31) {
              pcVar16 = "Unsupported HTTP version in response";
              goto LAB_00135fa4;
            }
            if (((pcVar16[6] == '.') && ((pcVar16[7] & 0xfeU) == 0x30)) &&
               ((pcVar16[8] == ' ' || (pcVar16[8] == '\t')))) {
              (data->req).httpversion = (byte)pcVar16[7] - 0x26;
              if ((((byte)(pcVar16[9] - 0x30U) < 10) && ((byte)(pcVar16[10] - 0x30U) < 10)) &&
                 ((byte)(pcVar16[0xb] - 0x30U) < 10)) {
                (data->req).httpcode =
                     (uint)(byte)(pcVar16[0xb] - 0x30U) +
                     (uint)(byte)(pcVar16[10] * '\n' + 0x20) +
                     (uint)(byte)(pcVar16[9] - 0x30U) * 100;
                cVar5 = pcVar16[0xc];
                if (((cVar5 == '\t') || (cVar5 == ' ')) || ((byte)(cVar5 - 10U) < 4))
                goto LAB_00135b18;
              }
            }
            pcVar16 = "Unsupported HTTP/1 subversion in response";
LAB_00135fa4:
            Curl_failf(data,pcVar16);
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
          if ((pcVar16[6] == ' ') || (pcVar16[6] == '\t')) {
            (data->req).httpversion = ((uint)bVar4 + (uint)bVar4 * 4) * 2 + -0x1e0;
            if (((byte)(pcVar16[7] - 0x30U) < 10) &&
               (((byte)(pcVar16[8] - 0x30U) < 10 && ((byte)(pcVar16[9] - 0x30U) < 10)))) {
              (data->req).httpcode =
                   (uint)(byte)(pcVar16[9] - 0x30U) +
                   (uint)(byte)(pcVar16[8] * '\n' + 0x20) + (uint)(byte)(pcVar16[7] - 0x30U) * 100;
              cVar5 = pcVar16[10];
              if ((cVar5 == '\t') || ((cVar5 == ' ' || ((byte)(cVar5 - 10U) < 4))))
              goto LAB_00135b18;
            }
          }
        }
        sVar13 = checkhttpprefix(data,hd,hdlen);
        if (sVar13 == STATUS_DONE) {
          (data->req).httpversion = 10;
          (data->req).httpcode = 200;
          pcVar21 = data->conn;
LAB_00135b18:
          CVar11 = Curl_http_statusline(data,pcVar21);
          if (CVar11 != CURLE_OK) {
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
          iVar20 = 0xc;
          goto LAB_001359d8;
        }
      }
      puVar2 = &(data->req).field_0xd9;
      *puVar2 = *puVar2 & 0xfe;
    }
    else {
LAB_001359d8:
      pvVar17 = memchr(hd,0,hdlen);
      if (pvVar17 == (void *)0x0) {
        iVar12 = (data->req).headerline;
        if ((iVar12 < 2) ||
           ((((*hd == ' ' || (*hd == '\t')) && (iVar12 != 2)) ||
            (pvVar17 = memchr(hd,0x3a,hdlen), pvVar17 != (void *)0x0)))) {
          CVar11 = Curl_http_header(data,hd,hdlen);
          if (CVar11 != CURLE_OK) {
            return CVar11;
          }
          Curl_debug(data,CURLINFO_HEADER_IN,hd,hdlen);
          iVar12 = iVar20 + 0x20;
          if (99 < (data->req).httpcode - 100U) {
            iVar12 = iVar20;
          }
          CVar11 = Curl_client_write(data,iVar12,hd,hdlen);
          if (CVar11 != CURLE_OK) {
            return CVar11;
          }
          CVar11 = Curl_bump_headersize(data,hdlen,false);
          return CVar11;
        }
        pcVar16 = "Header without colon";
      }
      else {
        pcVar16 = "Nul byte in header";
      }
      Curl_failf(data,pcVar16);
    }
    return CURLE_WEIRD_SERVER_REPLY;
  }
  Curl_dyn_init(&local_50,hdlen + 1);
  CVar11 = Curl_dyn_addn(&local_50,hd,hdlen);
  if (CVar11 != CURLE_OK) {
    return CVar11;
  }
  Curl_dyn_reset(&(data->state).headerb);
  pcVar16 = Curl_dyn_ptr(&local_50);
  hdlen_00 = Curl_dyn_len(&local_50);
  pcVar21 = data->conn;
  if ((((data->req).upgr101 == UPGR101_RECEIVED) && (pcVar21->httpversion != '\x14')) &&
     ((((data->set).field_0x8cd & 0x10) != 0 &&
      ((pcVar9 = (data->state).feat, pcVar9 == (curl_trc_feat *)0x0 || (0 < pcVar9->log_level))))))
  {
    Curl_infof(data,"Lying server, not serving HTTP/2");
  }
  uVar15 = (data->req).httpcode;
  if (pcVar16 != (char *)0x0 && (int)uVar15 < 200) {
    CVar11 = http_write_header(data,pcVar16,hdlen_00);
    if (CVar11 != CURLE_OK) {
      blen = 0;
      goto LAB_001362f3;
    }
    uVar15 = (data->req).httpcode;
    pcVar16 = (char *)0x0;
  }
  if ((int)uVar15 < 100) {
    blen = 0;
    Curl_failf(data,"Unsupported response code in HTTP response");
    CVar14 = CURLE_UNSUPPORTED_PROTOCOL;
    goto LAB_001362d4;
  }
  uVar6 = *(uint *)&(data->req).field_0xd9;
  if (uVar15 < 200) {
    *(uint *)&(data->req).field_0xd9 = uVar6 | 1;
    (data->req).headerline = 0;
    if ((char)uVar15 == 'e') {
      if (pcVar21->httpversion == '\v') {
        uVar8 = (data->req).upgr101;
        if (uVar8 == UPGR101_WS) {
          CVar11 = Curl_ws_accept(data,buf_remain,blen);
          CVar14 = CURLE_OK;
          if (CVar11 == CURLE_OK) {
            puVar2 = &(data->req).field_0xd9;
            *puVar2 = *puVar2 & 0xfe;
            if ((data->set).connect_only != '\0') {
              piVar3 = &(data->req).keepon;
              *(byte *)piVar3 = (byte)*piVar3 & 0xfe;
            }
          }
          else {
            blen = 0;
            CVar14 = CVar11;
          }
          goto LAB_001362d4;
        }
        if (uVar8 != UPGR101_H2) {
          *(uint *)&(data->req).field_0xd9 = uVar6 & 0xfffffffe;
          goto LAB_00135ba7;
        }
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar9 = (data->state).feat, pcVar9 == (curl_trc_feat *)0x0 || (0 < pcVar9->log_level))
           )) {
          Curl_infof(data,"Received 101, Switching to HTTP/2");
        }
        (data->req).upgr101 = UPGR101_RECEIVED;
        pCVar1 = &data->conn->bits;
        *pCVar1 = (ConnectBits)((ulong)*pCVar1 & 0xffffffffffdfffff);
        puVar2 = &(data->req).field_0xd9;
        *puVar2 = *puVar2 | 1;
        (data->req).headerline = 0;
        CVar14 = CURLE_UNSUPPORTED_PROTOCOL;
LAB_001362d2:
        blen = 0;
      }
      else {
        blen = 0;
        Curl_failf(data,"unexpected 101 response code");
        CVar14 = CURLE_WEIRD_SERVER_REPLY;
      }
    }
    else {
      if ((uVar15 & 0xff) == 100) {
        Curl_http_exp100_got100(data);
      }
LAB_00135ba7:
      blen = 0;
      CVar14 = CURLE_OK;
    }
  }
  else {
    *(uint *)&(data->req).field_0xd9 = uVar6 & 0xfffffffe;
    if ((data->req).upgr101 == UPGR101_H2) {
      pCVar1 = &data->conn->bits;
      *pCVar1 = (ConnectBits)((ulong)*pCVar1 & 0xffffffffffdfffff);
      Curl_multi_connchanged(data->multi);
    }
    if ((((((data->req).size == -1) && (((data->req).field_0xda & 0x10) == 0)) &&
         (((ulong)pcVar21->bits & 0x20) == 0)) &&
        ((pcVar21->httpversion == '\v' && ((pcVar21->handler->protocol & 0x40000) == 0)))) &&
       ((data->state).httpreq != '\x05')) {
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar9 = (data->state).feat, pcVar9 == (curl_trc_feat *)0x0 || (0 < pcVar9->log_level))))
      {
        Curl_infof(data,"no chunk, no close, no size. Assume close to signal end");
      }
      Curl_conncontrol(pcVar21,2);
    }
    uVar15 = (data->req).httpcode;
    if (((ulong)pcVar21->bits & 0x20) == 0) {
LAB_00136002:
      uVar22 = (ulong)uVar15;
    }
    else {
      if (uVar15 == 0x197) {
        uVar22 = 0x197;
        cVar7 = pcVar21->proxy_ntlm_state;
      }
      else {
        if (uVar15 != 0x191) goto LAB_00136002;
        uVar22 = 0x191;
        cVar7 = pcVar21->http_ntlm_state;
      }
      if (cVar7 == NTLMSTATE_TYPE2) {
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar9 = (data->state).feat, pcVar9 == (curl_trc_feat *)0x0 || (0 < pcVar9->log_level))
           )) {
          Curl_infof(data,"Connection closure while negotiating auth (HTTP 1.0?)");
          uVar15 = (data->req).httpcode;
        }
        puVar2 = &(data->state).field_0x774;
        *puVar2 = *puVar2 | 0x20;
        goto LAB_00136002;
      }
    }
    if ((data->req).upgr101 == UPGR101_WS) {
      pcVar19 = "Refused WebSockets upgrade: %d";
    }
    else {
      _Var10 = http_should_fail(data,(int)uVar22);
      if (!_Var10) {
        CVar14 = Curl_http_auth_act(data);
        if (CVar14 == CURLE_OK) {
          if (299 < (data->req).httpcode) {
            if ((((((data->req).field_0xdb & 4) == 0) && (((ulong)pcVar21->bits & 0x20) == 0)) &&
                (_Var10 = Curl_creader_will_rewind(data), !_Var10)) &&
               (((byte)((data->state).httpreq - 1) < 4 &&
                (_Var10 = Curl_req_done_sending(data), !_Var10)))) {
              if (((data->req).httpcode == 0x1a1) &&
                 (pCVar18 = Curl_creader_get_by_type(data,&cr_exp100),
                 pCVar18 != (Curl_creader *)0x0)) {
                if ((((data->req).writebytecount == 0) &&
                    (pCVar18 = Curl_creader_get_by_type(data,&cr_exp100),
                    pCVar18 != (Curl_creader *)0x0)) && (*(int *)((long)pCVar18->ctx + 0x30) == 1))
                {
                  if ((((data->set).field_0x8cd & 0x10) != 0) &&
                     ((pcVar9 = (data->state).feat, pcVar9 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar9->log_level)))) {
                    Curl_infof(data,"Got HTTP failure 417 while waiting for a 100");
                  }
                }
                else {
                  if ((((data->set).field_0x8cd & 0x10) != 0) &&
                     ((pcVar9 = (data->state).feat, pcVar9 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar9->log_level)))) {
                    Curl_infof(data,"Got HTTP failure 417 while sending data");
                  }
                  Curl_conncontrol(pcVar21,2);
                  http_perhapsrewind(data,pcVar21);
                }
                puVar2 = &(data->state).field_0x774;
                *puVar2 = *puVar2 | 0x80;
                pcVar19 = (*Curl_cstrdup)((data->state).url);
                (data->req).newurl = pcVar19;
                Curl_req_abort_sending(data);
              }
              else {
                uVar15 = (uint)*(undefined8 *)&(data->set).field_0x8ca;
                if ((uVar15 >> 0x14 & 1) == 0) {
                  if (((uVar15 >> 0x1c & 1) != 0) &&
                     ((pcVar9 = (data->state).feat, pcVar9 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar9->log_level)))) {
                    Curl_infof(data,"HTTP error before end of send, stop sending");
                  }
                  Curl_conncontrol(pcVar21,2);
                  CVar14 = Curl_req_abort_sending(data);
                  if (CVar14 != CURLE_OK) goto LAB_001362d2;
                }
                else {
                  if (((uVar15 >> 0x1c & 1) != 0) &&
                     ((pcVar9 = (data->state).feat, pcVar9 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar9->log_level)))) {
                    Curl_infof(data,"HTTP error before end of send, keep sending");
                  }
                  http_exp100_send_anyway(data);
                }
              }
            }
            _Var10 = Curl_creader_will_rewind(data);
            if ((_Var10) && (_Var10 = Curl_req_done_sending(data), !_Var10)) {
              if ((((data->set).field_0x8cd & 0x10) != 0) &&
                 ((pcVar9 = (data->state).feat, pcVar9 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar9->log_level)))) {
                Curl_infof(data,"Keep sending data to get tossed away");
              }
              piVar3 = &(data->req).keepon;
              *(byte *)piVar3 = (byte)*piVar3 | 2;
            }
          }
          uVar15 = *(uint *)&(data->req).field_0xd9;
          if ((uVar15 >> 0x11 & 1) != 0) {
            uVar15 = uVar15 | 8;
            *(uint *)&(data->req).field_0xd9 = uVar15;
          }
          if ((data->req).maxdownload == 0) {
            *(uint *)&(data->req).field_0xd9 = uVar15 | 8;
          }
          CVar14 = Curl_http_firstwrite(data);
          if (CVar14 == CURLE_OK) {
            CVar14 = Curl_http_size(data);
          }
        }
        goto LAB_001362d2;
      }
      pcVar19 = "The requested URL returned error: %d";
    }
    blen = 0;
    Curl_failf(data,pcVar19,uVar22);
    CVar14 = CURLE_HTTP_RETURNED_ERROR;
  }
LAB_001362d4:
  CVar11 = CVar14;
  if ((pcVar16 != (char *)0x0) &&
     (CVar11 = http_write_header(data,pcVar16,hdlen_00), CVar14 != CURLE_OK)) {
    CVar11 = CVar14;
  }
LAB_001362f3:
  *pconsumed = *pconsumed + blen;
  Curl_dyn_free(&local_50);
  return CVar11;
}

Assistant:

static CURLcode http_rw_hd(struct Curl_easy *data,
                           const char *hd, size_t hdlen,
                           const char *buf_remain, size_t blen,
                           size_t *pconsumed)
{
  CURLcode result = CURLE_OK;
  struct SingleRequest *k = &data->req;
  int writetype;

  *pconsumed = 0;
  if((0x0a == *hd) || (0x0d == *hd)) {
    /* Empty header line means end of headers! */
    struct dynbuf last_header;
    size_t consumed;

    Curl_dyn_init(&last_header, hdlen + 1);
    result = Curl_dyn_addn(&last_header, hd, hdlen);
    if(result)
      return result;

    /* analyze the response to find out what to do. */
    /* Caveat: we clear anything in the header brigade, because a
     * response might switch HTTP version which may call use recursively.
     * Not nice, but that is currently the way of things. */
    Curl_dyn_reset(&data->state.headerb);
    result = http_on_response(data, Curl_dyn_ptr(&last_header),
                              Curl_dyn_len(&last_header),
                              buf_remain, blen, &consumed);
    *pconsumed += consumed;
    Curl_dyn_free(&last_header);
    return result;
  }

  /*
   * Checks for special headers coming up.
   */

  writetype = CLIENTWRITE_HEADER;
  if(!k->headerline++) {
    /* This is the first header, it MUST be the error code line
       or else we consider this to be the body right away! */
    bool fine_statusline = FALSE;

    k->httpversion = 0; /* Do not know yet */
    if(data->conn->handler->protocol & PROTO_FAMILY_HTTP) {
      /*
       * https://datatracker.ietf.org/doc/html/rfc7230#section-3.1.2
       *
       * The response code is always a three-digit number in HTTP as the spec
       * says. We allow any three-digit number here, but we cannot make
       * guarantees on future behaviors since it is not within the protocol.
       */
      const char *p = hd;

      while(*p && ISBLANK(*p))
        p++;
      if(!strncmp(p, "HTTP/", 5)) {
        p += 5;
        switch(*p) {
        case '1':
          p++;
          if((p[0] == '.') && (p[1] == '0' || p[1] == '1')) {
            if(ISBLANK(p[2])) {
              k->httpversion = 10 + (p[1] - '0');
              p += 3;
              if(ISDIGIT(p[0]) && ISDIGIT(p[1]) && ISDIGIT(p[2])) {
                k->httpcode = (p[0] - '0') * 100 + (p[1] - '0') * 10 +
                  (p[2] - '0');
                p += 3;
                if(ISSPACE(*p))
                  fine_statusline = TRUE;
              }
            }
          }
          if(!fine_statusline) {
            failf(data, "Unsupported HTTP/1 subversion in response");
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
          break;
        case '2':
        case '3':
          if(!ISBLANK(p[1]))
            break;
          k->httpversion = (*p - '0') * 10;
          p += 2;
          if(ISDIGIT(p[0]) && ISDIGIT(p[1]) && ISDIGIT(p[2])) {
            k->httpcode = (p[0] - '0') * 100 + (p[1] - '0') * 10 +
              (p[2] - '0');
            p += 3;
            if(!ISSPACE(*p))
              break;
            fine_statusline = TRUE;
          }
          break;
        default: /* unsupported */
          failf(data, "Unsupported HTTP version in response");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
      }

      if(!fine_statusline) {
        /* If user has set option HTTP200ALIASES,
           compare header line against list of aliases
        */
        statusline check = checkhttpprefix(data, hd, hdlen);
        if(check == STATUS_DONE) {
          fine_statusline = TRUE;
          k->httpcode = 200;
          k->httpversion = 10;
        }
      }
    }
    else if(data->conn->handler->protocol & CURLPROTO_RTSP) {
      const char *p = hd;
      while(*p && ISBLANK(*p))
        p++;
      if(!strncmp(p, "RTSP/", 5)) {
        p += 5;
        if(ISDIGIT(*p)) {
          p++;
          if((p[0] == '.') && ISDIGIT(p[1])) {
            if(ISBLANK(p[2])) {
              p += 3;
              if(ISDIGIT(p[0]) && ISDIGIT(p[1]) && ISDIGIT(p[2])) {
                k->httpcode = (p[0] - '0') * 100 + (p[1] - '0') * 10 +
                  (p[2] - '0');
                p += 3;
                if(ISSPACE(*p)) {
                  fine_statusline = TRUE;
                  k->httpversion = 11; /* RTSP acts like HTTP 1.1 */
                }
              }
            }
          }
        }
        if(!fine_statusline)
          return CURLE_WEIRD_SERVER_REPLY;
      }
    }

    if(fine_statusline) {
      result = Curl_http_statusline(data, data->conn);
      if(result)
        return result;
      writetype |= CLIENTWRITE_STATUS;
    }
    else {
      k->header = FALSE;   /* this is not a header line */
      return CURLE_WEIRD_SERVER_REPLY;
    }
  }

  result = verify_header(data, hd, hdlen);
  if(result)
    return result;

  result = Curl_http_header(data, hd, hdlen);
  if(result)
    return result;

  /*
   * Taken in one (more) header. Write it to the client.
   */
  Curl_debug(data, CURLINFO_HEADER_IN, (char *)hd, hdlen);

  if(k->httpcode/100 == 1)
    writetype |= CLIENTWRITE_1XX;
  result = Curl_client_write(data, writetype, hd, hdlen);
  if(result)
    return result;

  result = Curl_bump_headersize(data, hdlen, FALSE);
  if(result)
    return result;

  return CURLE_OK;
}